

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

bool __thiscall
SQCompilation::NodeEqualChecker::cmpSwitch
          (NodeEqualChecker *this,SwitchStatement *l,SwitchStatement *r)

{
  size_type_conflict sVar1;
  SwitchCase *pSVar2;
  SwitchCase *pSVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  
  bVar4 = check(this,&l->_expr->super_Node,&r->_expr->super_Node);
  if ((!bVar4) || (sVar1 = (l->_cases)._size, sVar1 != (r->_cases)._size)) {
    return false;
  }
  if (sVar1 != 0) {
    lVar5 = 8;
    uVar6 = 0;
    do {
      pSVar2 = (l->_cases)._vals;
      pSVar3 = (r->_cases)._vals;
      bVar4 = check(this,*(Node **)((long)pSVar2 + lVar5 + -8),*(Node **)((long)pSVar3 + lVar5 + -8)
                   );
      if (!bVar4) {
        return false;
      }
      bVar4 = check(this,*(Node **)((long)&pSVar2->val + lVar5),
                    *(Node **)((long)&pSVar3->val + lVar5));
      if (!bVar4) {
        return false;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (l->_cases)._size);
  }
  bVar4 = check(this,&((l->_defaultCase).stmt)->super_Node,&((r->_defaultCase).stmt)->super_Node);
  return bVar4;
}

Assistant:

bool cmpSwitch(const SwitchStatement *l, const SwitchStatement *r) const {
    if (!check(l->expression(), r->expression()))
      return false;

    const auto &lcases = l->cases();
    const auto &rcases = r->cases();

    if (lcases.size() != rcases.size())
      return false;

    for (int32_t i = 0; i < lcases.size(); ++i) {
      const auto &lc = lcases[i];
      const auto &rc = rcases[i];

      if (!check(lc.val, rc.val))
        return false;

      if (!check(lc.stmt, rc.stmt))
        return false;
    }

    return check(l->defaultCase().stmt, r->defaultCase().stmt);
  }